

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O3

void wabt::RenameToIdentifier
               (string *name,Index i,BindingHash *bh,
               set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
               *filter)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *this;
  char cVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  const_iterator cVar9;
  size_type sVar10;
  uint uVar11;
  long lVar12;
  uint __val;
  ulong uVar13;
  size_type sVar14;
  bool bVar15;
  string s;
  string_view word;
  key_type local_a0;
  _Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
  *local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_78;
  Index local_6c;
  key_type local_68;
  char acStack_58 [16];
  Index local_48;
  _Base_ptr local_38;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  sVar2 = name->_M_string_length;
  local_78 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              *)bh;
  local_6c = i;
  if (sVar2 != 0) {
    pcVar3 = (name->_M_dataplus)._M_p;
    local_38 = &(filter->_M_t)._M_impl.super__Rb_tree_header._M_header;
    lVar12 = 0;
    uVar13 = 0;
    sVar14 = 1;
    local_80 = &filter->_M_t;
    do {
      bVar1 = pcVar3[sVar14 - 1];
      lVar12 = (lVar12 + (ulong)(bVar1 == 0x28)) - (ulong)(bVar1 == 0x29);
      uVar8 = uVar13;
      if (lVar12 == 0) {
        iVar7 = isalnum((uint)bVar1);
        if (bVar1 == 0x5f || iVar7 == 0) {
          if ((local_a0._M_string_length != 0) &&
             (local_a0._M_dataplus._M_p[local_a0._M_string_length - 1] != '_')) {
            std::__cxx11::string::push_back((char)&local_a0);
            sVar4 = local_68.size_;
            if (local_80 !=
                (_Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                 *)0x0) goto LAB_0014f71f;
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_a0);
          if ((local_80 !=
               (_Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                *)0x0) && (sVar4 = local_68.size_, sVar14 == name->_M_string_length)) {
LAB_0014f71f:
            uVar8 = local_a0._M_string_length - (bVar1 == 0x5f || iVar7 == 0);
            local_68.size_ = uVar8 - uVar13;
            if (uVar8 < uVar13 || local_68.size_ == 0) {
              local_68.size_ = sVar4;
              __assert_fail("word_end > word_start",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler-naming.h"
                            ,0x44,
                            "void wabt::RenameToIdentifier(std::string &, Index, BindingHash &, const std::set<string_view> *)"
                           );
            }
            local_68.data_ = local_a0._M_dataplus._M_p + uVar13;
            cVar9 = std::
                    _Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                    ::find(local_80,&local_68);
            uVar8 = local_a0._M_string_length;
            if (cVar9._M_node != local_38) {
              std::__cxx11::string::resize((ulong)&local_a0,(char)uVar13);
              uVar8 = local_a0._M_string_length;
            }
          }
        }
      }
      bVar15 = sVar14 != sVar2;
      uVar13 = uVar8;
      sVar14 = sVar14 + 1;
    } while (bVar15);
    if (local_a0._M_string_length != 0) {
      if (local_a0._M_dataplus._M_p[local_a0._M_string_length - 1] == '_') {
        std::__cxx11::string::_M_erase((ulong)&local_a0,local_a0._M_string_length - 1);
      }
      if (100 < local_a0._M_string_length) {
        std::__cxx11::string::resize((ulong)&local_a0,'d');
      }
    }
  }
  this = local_78;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::_M_erase(local_78,name);
  sVar2 = local_a0._M_string_length;
  sVar10 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::count(this,&local_a0);
  if (sVar10 != 0) {
    __val = 0;
    do {
      __val = __val + 1;
      std::__cxx11::string::resize((ulong)&local_a0,(char)sVar2);
      std::__cxx11::string::push_back((char)&local_a0);
      cVar6 = '\x01';
      if (9 < __val) {
        uVar11 = __val;
        cVar5 = '\x04';
        do {
          cVar6 = cVar5;
          if (uVar11 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0014f881;
          }
          if (uVar11 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0014f881;
          }
          if (uVar11 < 10000) goto LAB_0014f881;
          bVar15 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar5 = cVar6 + '\x04';
        } while (bVar15);
        cVar6 = cVar6 + '\x01';
      }
LAB_0014f881:
      local_68.data_ = acStack_58;
      std::__cxx11::string::_M_construct((ulong)&local_68,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_68.data_,(uint)local_68.size_,__val);
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_68.data_);
      if (local_68.data_ != acStack_58) {
        operator_delete(local_68.data_);
      }
      sVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               ::count(local_78,&local_a0);
    } while (sVar10 != 0);
  }
  std::__cxx11::string::_M_assign((string *)name);
  acStack_58[0] = '\0';
  acStack_58[1] = '\0';
  acStack_58[2] = '\0';
  acStack_58[3] = '\0';
  acStack_58[4] = '\0';
  acStack_58[5] = '\0';
  acStack_58[6] = '\0';
  acStack_58[7] = '\0';
  acStack_58[8] = '\0';
  acStack_58[9] = '\0';
  acStack_58[10] = '\0';
  acStack_58[0xb] = '\0';
  local_68.data_ = (char *)0x0;
  local_68.size_._0_4_ = 0;
  local_68.size_._4_4_ = 0;
  local_48 = local_6c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::__cxx11::string&,wabt::Binding>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)local_78,0,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void RenameToIdentifier(std::string& name, Index i,
                               BindingHash& bh,
                               const std::set<string_view>* filter) {
  // Filter out non-identifier characters, and try to reduce the size of
  // gigantic C++ signature names.
  std::string s;
  size_t nesting = 0;
  size_t read = 0;
  size_t word_start = 0;
  for (auto c : name) {
    read++;
    // We most certainly don't want to parse the entirety of C++ signatures,
    // but these names are sometimes several lines long, so would be great
    // to trim down. One quick way to do that is to remove anything between
    // nested (), which usually means the parameter list.
    if (c == '(') {
      nesting++;
    }
    if (c == ')') {
      nesting--;
    }
    if (nesting) {
      continue;
    }
    if (!isalnum(static_cast<unsigned char>(c))) {
      c = '_';
    }
    if (c == '_') {
      if (s.empty()) {
        continue;  // Skip leading.
      }
      if (s.back() == '_') {
        continue;  // Consecutive.
      }
    }
    s += c;
    if (filter && (c == '_' || read == name.size())) {
      // We found a "word" inside a snake_case identifier.
      auto word_end = s.size();
      if (c == '_') {
        word_end--;
      }
      assert(word_end > word_start);
      auto word = string_view(s.c_str() + word_start, word_end - word_start);
      if (filter->find(word) != filter->end()) {
        s.resize(word_start);
      }
      word_start = s.size();
    }
  }
  if (!s.empty() && s.back() == '_') {
    s.pop_back();  // Trailing.
  }
  // If after all this culling, we're still gigantic (STL identifier can
  // easily be hundreds of chars in size), just cut the identifier
  // down, it will be disambiguated below, if needed.
  const size_t max_identifier_length = 100;
  if (s.size() > max_identifier_length) {
    s.resize(max_identifier_length);
  }
  // Remove original binding first, such that it doesn't match with our
  // new name.
  bh.erase(name);
  // Find a unique name.
  Index disambiguator = 0;
  auto base_len = s.size();
  for (;;) {
    if (bh.count(s) == 0) {
      break;
    }
    disambiguator++;
    s.resize(base_len);
    s += '_';
    s += std::to_string(disambiguator);
  }
  // Replace name in bindings.
  name = s;
  bh.emplace(s, Binding(i));
}